

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
visit_string(basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
             *this,string_view_type *sv,semantic_tag tag,ser_context *param_3,error_code *param_4)

{
  stream_sink<char> *this_00;
  size_t *psVar1;
  byte bVar2;
  pointer peVar3;
  
  peVar3 = (this->stack_).
           super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((((this->stack_).
        super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
        ._M_impl.super__Vector_impl_data._M_start != peVar3) && (peVar3[-1].type_ == array)) &&
     (peVar3[-1].count_ != 0)) {
    stream_sink<char>::push_back(&this->sink_,',');
  }
  if (tag == bigdec) {
    if ((this->options_).bignum_format_ != number) goto LAB_001acdac;
  }
  else if (tag != bigint) {
LAB_001acdac:
    this_00 = &this->sink_;
    stream_sink<char>::push_back(this_00,'\"');
    bVar2 = (this->options_).field_0x8;
    detail::escape_string<char,jsoncons::stream_sink<char>>
              (sv->_M_str,sv->_M_len,(bool)(bVar2 & 1),(bool)((bVar2 & 2) >> 1),this_00);
    stream_sink<char>::push_back(this_00,'\"');
    goto LAB_001acde6;
  }
  write_bigint_value(this,sv);
LAB_001acde6:
  peVar3 = (this->stack_).
           super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
      ._M_impl.super__Vector_impl_data._M_start != peVar3) {
    psVar1 = &peVar3[-1].count_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& sv, semantic_tag tag, const ser_context&, std::error_code&) final
        {
            if (!stack_.empty() && stack_.back().is_array() && stack_.back().count() > 0)
            {
                sink_.push_back(',');
            }

            switch (tag)
            {
                case semantic_tag::bigint:
                    write_bigint_value(sv);
                    break;
                case semantic_tag::bigdec:
                {
                    // output lossless number
                    if (options_.bignum_format() == bignum_format_kind::raw)
                    {
                        write_bigint_value(sv);
                        break;
                    }
                    JSONCONS_FALLTHROUGH;
                }
                default:
                {
                    sink_.push_back('\"');
                    jsoncons::detail::escape_string(sv.data(), sv.length(),options_.escape_all_non_ascii(),options_.escape_solidus(),sink_);
                    sink_.push_back('\"');
                    break;
                }
            }

            if (!stack_.empty())
            {
                stack_.back().increment_count();
            }
            JSONCONS_VISITOR_RETURN;
        }